

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)80>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<70u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<75u,Fixpp::Type::String>>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<87u,Fixpp::Type::Int>>,Fixpp::TagT<88u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_P_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<70U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<87U,_Fixpp::Type::Int>_>,_Fixpp::TagT<88U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor_00;
  bool bVar1;
  uint tag;
  undefined1 local_70 [8];
  pair<const_char_*,_unsigned_long> view;
  Token valueToken;
  StreamCursor *cursor;
  bool param_5_local;
  bool param_4_local;
  TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_P_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<70U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<87U,_Fixpp::Type::Int>_>,_Fixpp::TagT<88U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *tagSet_local;
  ParsingContext *context_local;
  Field *field_local;
  FieldParser<Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_> *this_local;
  
  cursor_00 = context->cursor;
  StreamCursor::Token::Token((Token *)&view.second,context->cursor);
  bVar1 = match_until_fast('|',cursor_00);
  if (bVar1) {
    _local_70 = StreamCursor::Token::view((Token *)&view.second);
    bVar1 = StreamCursor::advance(cursor_00,1);
    if (bVar1) {
      FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>::set(field,(View *)local_70);
      tag = FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>::tag(field);
      TagSet<Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<70U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<87U,_Fixpp::Type::Int>_>,_Fixpp::TagT<88U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<70U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<75U,_Fixpp::Type::String>_>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<87U,_Fixpp::Type::Int>_>,_Fixpp::TagT<88U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
            ,tag);
    }
    else {
      ParsingContext::setError(context,Incomplete,"Expected value after tag \'%d\', got EOF",0x163);
    }
  }
  else {
    ParsingContext::setError(context,ParsingError,"Expected value tag \'%d\', got EOF",0x163);
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }